

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

GenericFunctionInstanceTypeResponse * __thiscall
SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
::find(SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
       *this,GenericFunctionInstanceTypeRequest *key)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  GenericFunctionInstanceTypeResponse *unaff_R12;
  Node *this_00;
  uint uVar4;
  GenericFunctionInstanceTypeRequest local_68;
  
  uVar2 = this->bucketCount - 1;
  if (this->bucketCount != 0) {
    uVar4 = key->hash & uVar2;
    uVar3 = 0;
    do {
      this_00 = this->data + uVar4;
      local_68.hash = 0;
      local_68.aliases.head = (MatchData *)0x0;
      local_68.aliases.tail = (MatchData *)0x0;
      local_68.arguments.head = (TypeHandle *)0x0;
      local_68.arguments.tail = (TypeHandle *)0x0;
      local_68.parentType = (TypeBase *)0x0;
      local_68.function = (FunctionData *)0x0;
      bVar1 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,&local_68);
      if (bVar1) {
        bVar1 = false;
        unaff_R12 = (GenericFunctionInstanceTypeResponse *)0x0;
      }
      else {
        bVar1 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,key);
        if (bVar1) {
          unaff_R12 = &this_00->value;
          bVar1 = false;
        }
        else {
          uVar4 = uVar4 + uVar3 + 1 & uVar2;
          bVar1 = true;
        }
      }
      if (!bVar1) {
        return unaff_R12;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->bucketCount);
  }
  return (GenericFunctionInstanceTypeResponse *)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}